

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dec_api.c
# Opt level: O1

MPP_RET dummy_dec_parse(void *dec,HalDecTask *task)

{
  RK_S32 RVar1;
  MppBufSlots slots;
  MPP_RET MVar2;
  RK_U32 v;
  uint uVar3;
  ulong uVar4;
  RK_U32 v_00;
  long lVar5;
  RK_S32 output;
  MppFrame frame;
  RK_S32 local_44;
  ulong local_40;
  MppFrame local_38;
  
  local_38 = (MppFrame)0x0;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"dummy_dec_api","found NULL intput\n","dummy_dec_parse");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    slots = *dec;
    uVar3 = *(uint *)((long)dec + 0x40);
    uVar4 = (ulong)uVar3;
    mpp_frame_init(&local_38);
    local_40 = uVar4;
    if (*(int *)((long)dec + 0x3c) == 0) {
      mpp_buf_slot_setup(slots,0x10);
      *(undefined4 *)((long)dec + 0x3c) = 1;
      v_00 = 0x500;
      v = 0x2d0;
    }
    else {
      v_00 = 0x500;
      if (1 < uVar3) {
        v_00 = 0x780;
      }
      v = 0x2d0;
      if (1 < uVar3) {
        v = 0x440;
      }
    }
    mpp_frame_set_width(local_38,v_00);
    mpp_frame_set_height(local_38,v);
    mpp_frame_set_hor_stride(local_38,v_00);
    mpp_frame_set_ver_stride(local_38,v);
    mpp_buf_slot_get_unused(slots,&local_44);
    mpp_buf_slot_set_flag(slots,local_44,SLOT_HAL_OUTPUT);
    task->output = local_44;
    mpp_frame_set_pts(local_38,*(RK_S64 *)((long)dec + 0x30));
    mpp_buf_slot_set_prop(slots,local_44,SLOT_FRAME,local_38);
    mpp_frame_deinit(&local_38);
    if ((local_38 != (void *)0x0) &&
       (_mpp_log_l(2,"dummy_dec_api","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "((void*)0) == frame","dummy_dec_parse",0xee), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    task->refer[0xc] = -1;
    task->refer[0xd] = -1;
    task->refer[0xe] = -1;
    task->refer[0xf] = -1;
    task->refer[8] = -1;
    task->refer[9] = -1;
    task->refer[10] = -1;
    task->refer[0xb] = -1;
    task->refer[4] = -1;
    task->refer[5] = -1;
    task->refer[6] = -1;
    task->refer[7] = -1;
    task->refer[0] = -1;
    task->refer[1] = -1;
    task->refer[2] = -1;
    task->refer[3] = -1;
    task->refer[0x10] = -1;
    lVar5 = 0;
    do {
      RVar1 = *(RK_S32 *)((long)dec + lVar5 * 4 + 0x48);
      if (-1 < RVar1) {
        task->refer[lVar5] = RVar1;
        mpp_buf_slot_set_flag(slots,RVar1,SLOT_HAL_INPUT);
        mpp_buf_slot_set_flag(slots,RVar1,SLOT_CODEC_USE);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    mpp_buf_slot_set_flag(slots,local_44,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots,local_44,QUEUE_DISPLAY);
    uVar3 = (uint)local_40;
    if (*(int *)((long)dec + 0x38) == 0) {
      uVar4 = (ulong)(uVar3 & 1);
      RVar1 = *(RK_S32 *)((long)dec + uVar4 * 4 + 0x48);
      if (-1 < RVar1) {
        mpp_buf_slot_clr_flag(slots,RVar1,SLOT_CODEC_USE);
      }
      *(RK_S32 *)((long)dec + uVar4 * 4 + 0x48) = local_44;
      mpp_buf_slot_set_flag(slots,local_44,SLOT_CODEC_USE);
    }
    else {
      lVar5 = 0;
      do {
        mpp_buf_slot_clr_flag(slots,*(RK_S32 *)((long)dec + lVar5 * 4 + 0x48),SLOT_CODEC_USE);
        *(undefined4 *)((long)dec + lVar5 * 4 + 0x48) = 0xffffffff;
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
    }
    *(uint *)((long)dec + 0x40) = uVar3 + 1;
    MVar2 = MPP_OK;
  }
  return MVar2;
}

Assistant:

MPP_RET dummy_dec_parse(void *dec, HalDecTask *task)
{
    DummyDec *p;
    RK_S32 output;
    MppFrame frame = NULL;
    RK_U32 frame_count;
    MppBufSlots slots;
    RK_S32 i;
    RK_U32 width, height;

    if (NULL == dec) {
        mpp_err_f("found NULL intput\n");
        return MPP_ERR_NULL_PTR;
    }
    p = (DummyDec *)dec;

    slots = p->frame_slots;
    frame_count = p->frame_count;

    width = DUMMY_DEC_FRAME_WIDTH;
    height = DUMMY_DEC_FRAME_HEIGHT;

    mpp_frame_init(&frame);

    if (!p->slots_inited) {
        mpp_buf_slot_setup(slots, DUMMY_DEC_FRAME_COUNT);
        p->slots_inited = 1;
    } else if (frame_count >= 2) {
        // do info change test
        width = DUMMY_DEC_FRAME_NEW_WIDTH;
        height = DUMMY_DEC_FRAME_NEW_HEIGHT;
    }

    mpp_frame_set_width(frame, width);
    mpp_frame_set_height(frame, height);
    mpp_frame_set_hor_stride(frame, MPP_ALIGN(width, 16));
    mpp_frame_set_ver_stride(frame, MPP_ALIGN(height, 16));

    /*
     * set slots information
     * 1. output index MUST be set
     * 2. get unused index for output if needed
     * 3. set output index as hal_input
     * 4. set frame information to output index
     * 5. if one frame can be display, it SHOULD be enqueued to display queue
     */
    mpp_buf_slot_get_unused(slots, &output);
    mpp_buf_slot_set_flag(slots, output, SLOT_HAL_OUTPUT);
    task->output = output;

    mpp_frame_set_pts(frame, p->task_pts);
    mpp_buf_slot_set_prop(slots, output, SLOT_FRAME, frame);
    mpp_frame_deinit(&frame);
    mpp_assert(NULL == frame);

    /*
     * setup output task
     * 1. valid flag MUST be set if need hardware to run once
     * 2. set output slot index
     * 3. set reference slot index
     */
    memset(&task->refer, -1, sizeof(task->refer));
    for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
        RK_S32 index = p->slot_index[i];
        if (index >= 0) {
            task->refer[i] = index;
            mpp_buf_slot_set_flag(slots, index, SLOT_HAL_INPUT);
            mpp_buf_slot_set_flag(slots, index, SLOT_CODEC_USE);
        }
    }

    /*
     * update dpb status assuming that hw has decoded the frame
     */
    mpp_buf_slot_set_flag(slots, output, SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots, output, QUEUE_DISPLAY);

    // add new reference buffer
    if (p->task_eos) {
        for (i = 0; i < DUMMY_DEC_REF_COUNT; i++) {
            mpp_buf_slot_clr_flag(slots, p->slot_index[i], SLOT_CODEC_USE);
            p->slot_index[i] = -1;
        }
    } else {
        // clear unreference buffer
        RK_U32 replace_index = frame_count & 1;
        if (p->slot_index[replace_index] >= 0)
            mpp_buf_slot_clr_flag(slots, p->slot_index[replace_index], SLOT_CODEC_USE);

        p->slot_index[replace_index] = output;
        mpp_buf_slot_set_flag(slots, output, SLOT_CODEC_USE);
    }

    p->frame_count = ++frame_count;

    return MPP_OK;
}